

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_3353::ProfileDataTest_StartStopNoOptionsEmpty_Test::
~ProfileDataTest_StartStopNoOptionsEmpty_Test(ProfileDataTest_StartStopNoOptionsEmpty_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_ProfileDataTest).super_Test._vptr_Test = (_func_int **)&PTR__ProfileDataTest_00153940
  ;
  pcVar2 = (this->super_ProfileDataTest).checker_.filename_._M_dataplus._M_p;
  paVar1 = &(this->super_ProfileDataTest).checker_.filename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  ProfileData::~ProfileData(&(this->super_ProfileDataTest).collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(ProfileDataTest, StartStopNoOptionsEmpty) {
  // We're not requesting a specific period, implementation can do
  // whatever it likes.
  ProfileDataSlot slots[] = {
    0, 3, 0, 0 /* skipped */, 0,        // binary header
    0, 1, 0                             // binary trailer
  };
  int slots_to_skip[] = { 3 };

  ExpectStopped();
  EXPECT_TRUE(collector_.Start(checker_.filename().c_str(),
                               ProfileData::Options()));
  ExpectRunningSamples(0);
  collector_.Stop();
  ExpectStopped();
  EXPECT_EQ(kNoError, checker_.ValidateProfile());
  EXPECT_EQ(kNoError, checker_.CheckWithSkips(slots, arraysize(slots),
                                              slots_to_skip,
                                              arraysize(slots_to_skip)));
}